

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O3

void cf_gcm_encrypt_final(cf_gcm_ctx *gcmctx,uint8_t *tag,size_t ntag)

{
  size_t i;
  size_t sVar1;
  uint8_t full_tag [16];
  byte local_28 [16];
  
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_28[4] = 0;
  local_28[5] = 0;
  local_28[6] = 0;
  local_28[7] = 0;
  local_28[8] = 0;
  local_28[9] = 0;
  local_28[10] = 0;
  local_28[0xb] = 0;
  local_28[0xc] = 0;
  local_28[0xd] = 0;
  local_28[0xe] = 0;
  local_28[0xf] = 0;
  ghash_final(&gcmctx->gh,local_28);
  if (ntag - 2 < 0xf) {
    sVar1 = 0;
    do {
      tag[sVar1] = gcmctx->e_Y0[sVar1] ^ local_28[sVar1];
      sVar1 = sVar1 + 1;
    } while (ntag != sVar1);
    local_28[0] = 0;
    local_28[1] = 0;
    local_28[2] = 0;
    local_28[3] = 0;
    local_28[4] = 0;
    local_28[5] = 0;
    local_28[6] = 0;
    local_28[7] = 0;
    local_28[8] = 0;
    local_28[9] = 0;
    local_28[10] = 0;
    local_28[0xb] = 0;
    local_28[0xc] = 0;
    local_28[0xd] = 0;
    local_28[0xe] = 0;
    local_28[0xf] = 0;
    memset(gcmctx,0,0xb8);
    return;
  }
  abort();
}

Assistant:

void cf_gcm_encrypt_final(cf_gcm_ctx *gcmctx, uint8_t *tag, size_t ntag)
{
  /* Post-process ghash output */
  uint8_t full_tag[16] = { 0 };
  ghash_final(&gcmctx->gh, full_tag);
  
  assert(ntag > 1 && ntag <= 16);
  xor_bb(tag, full_tag, gcmctx->e_Y0, ntag);

  mem_clean(full_tag, sizeof full_tag);
  mem_clean(gcmctx, sizeof *gcmctx);
}